

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidBuildAContentModel(xmlElementContentPtr content,xmlValidCtxtPtr ctxt,xmlChar *name)

{
  xmlElementContentOccur xVar1;
  int iVar2;
  xmlChar **token;
  xmlAutomataStatePtr pxVar3;
  xmlAutomataStatePtr pxVar4;
  xmlAutomataStatePtr pxVar5;
  bool bVar6;
  xmlElementContentOccur ocur_1;
  xmlAutomataStatePtr oldend_1;
  xmlAutomataStatePtr oldstate_2;
  xmlElementContentOccur ocur;
  xmlAutomataStatePtr oldend;
  xmlAutomataStatePtr oldstate_1;
  xmlChar *fullname;
  xmlChar fn [50];
  xmlAutomataStatePtr oldstate;
  xmlChar *name_local;
  xmlValidCtxtPtr ctxt_local;
  xmlElementContentPtr content_local;
  
  if (content == (xmlElementContentPtr)0x0) {
    xmlErrValidNode(ctxt,(xmlNodePtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "Found NULL content in content model of %s\n",name,(xmlChar *)0x0,(xmlChar *)0x0
                   );
    return 0;
  }
  ctxt_local = (xmlValidCtxtPtr)content;
  switch(content->type) {
  case XML_ELEMENT_CONTENT_PCDATA:
    xmlErrValidNode(ctxt,(xmlNodePtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "Found PCDATA in content model of %s\n",name,(xmlChar *)0x0,(xmlChar *)0x0);
    return 0;
  case XML_ELEMENT_CONTENT_ELEMENT:
    unique0x00012000 = ctxt->state;
    token = (xmlChar **)xmlBuildQName(content->name,content->prefix,(xmlChar *)&fullname,0x32);
    if (token == (xmlChar **)0x0) {
      xmlVErrMemory(ctxt);
      return 0;
    }
    switch(content->ocur) {
    case XML_ELEMENT_CONTENT_ONCE:
      pxVar3 = xmlAutomataNewTransition
                         (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,(xmlChar *)token,(void *)0x0
                         );
      ctxt->state = pxVar3;
      break;
    case XML_ELEMENT_CONTENT_OPT:
      pxVar3 = xmlAutomataNewTransition
                         (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,(xmlChar *)token,(void *)0x0
                         );
      ctxt->state = pxVar3;
      xmlAutomataNewEpsilon(ctxt->am,stack0xffffffffffffffd0,ctxt->state);
      break;
    case XML_ELEMENT_CONTENT_MULT:
      pxVar3 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar3;
      xmlAutomataNewTransition(ctxt->am,ctxt->state,ctxt->state,(xmlChar *)token,(void *)0x0);
      break;
    case XML_ELEMENT_CONTENT_PLUS:
      pxVar3 = xmlAutomataNewTransition
                         (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,(xmlChar *)token,(void *)0x0
                         );
      ctxt->state = pxVar3;
      xmlAutomataNewTransition(ctxt->am,ctxt->state,ctxt->state,(xmlChar *)token,(void *)0x0);
    }
    if ((token != &fullname) && (token != (xmlChar **)content->name)) {
      (*xmlFree)(token);
    }
    break;
  case XML_ELEMENT_CONTENT_SEQ:
    oldend = ctxt->state;
    xVar1 = content->ocur;
    if (xVar1 != XML_ELEMENT_CONTENT_ONCE) {
      pxVar3 = xmlAutomataNewEpsilon(ctxt->am,oldend,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar3;
      oldend = ctxt->state;
    }
    do {
      iVar2 = xmlValidBuildAContentModel((xmlElementContentPtr)ctxt_local->warning,ctxt,name);
      if (iVar2 == 0) {
        return 0;
      }
      ctxt_local = (xmlValidCtxtPtr)ctxt_local->node;
      bVar6 = false;
      if (*(xmlElementContentType *)&((xmlNodePtr)ctxt_local)->_private == XML_ELEMENT_CONTENT_SEQ)
      {
        bVar6 = *(xmlElementContentOccur *)((long)&((xmlNodePtr)ctxt_local)->_private + 4) ==
                XML_ELEMENT_CONTENT_ONCE;
      }
    } while (bVar6);
    iVar2 = xmlValidBuildAContentModel((xmlElementContentPtr)ctxt_local,ctxt,name);
    if (iVar2 == 0) {
      return 0;
    }
    pxVar3 = ctxt->state;
    pxVar4 = xmlAutomataNewEpsilon(ctxt->am,pxVar3,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar4;
    switch(xVar1) {
    case XML_ELEMENT_CONTENT_ONCE:
      break;
    case XML_ELEMENT_CONTENT_OPT:
      xmlAutomataNewEpsilon(ctxt->am,oldend,ctxt->state);
      break;
    case XML_ELEMENT_CONTENT_MULT:
      xmlAutomataNewEpsilon(ctxt->am,oldend,ctxt->state);
      xmlAutomataNewEpsilon(ctxt->am,pxVar3,oldend);
      break;
    case XML_ELEMENT_CONTENT_PLUS:
      xmlAutomataNewEpsilon(ctxt->am,pxVar3,oldend);
    }
    break;
  case XML_ELEMENT_CONTENT_OR:
    xVar1 = content->ocur;
    if ((xVar1 == XML_ELEMENT_CONTENT_PLUS) || (xVar1 == XML_ELEMENT_CONTENT_MULT)) {
      pxVar3 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar3;
    }
    pxVar3 = ctxt->state;
    pxVar4 = xmlAutomataNewState(ctxt->am);
    do {
      ctxt->state = pxVar3;
      iVar2 = xmlValidBuildAContentModel((xmlElementContentPtr)ctxt_local->warning,ctxt,name);
      if (iVar2 == 0) {
        return 0;
      }
      xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar4);
      ctxt_local = (xmlValidCtxtPtr)ctxt_local->node;
      bVar6 = false;
      if (*(xmlElementContentType *)&((xmlNodePtr)ctxt_local)->_private == XML_ELEMENT_CONTENT_OR) {
        bVar6 = *(xmlElementContentOccur *)((long)&((xmlNodePtr)ctxt_local)->_private + 4) ==
                XML_ELEMENT_CONTENT_ONCE;
      }
    } while (bVar6);
    ctxt->state = pxVar3;
    iVar2 = xmlValidBuildAContentModel((xmlElementContentPtr)ctxt_local,ctxt,name);
    if (iVar2 == 0) {
      return 0;
    }
    xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar4);
    pxVar5 = xmlAutomataNewEpsilon(ctxt->am,pxVar4,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar5;
    switch(xVar1) {
    case XML_ELEMENT_CONTENT_ONCE:
      break;
    case XML_ELEMENT_CONTENT_OPT:
      xmlAutomataNewEpsilon(ctxt->am,pxVar3,ctxt->state);
      break;
    case XML_ELEMENT_CONTENT_MULT:
      xmlAutomataNewEpsilon(ctxt->am,pxVar3,ctxt->state);
      xmlAutomataNewEpsilon(ctxt->am,pxVar4,pxVar3);
      break;
    case XML_ELEMENT_CONTENT_PLUS:
      xmlAutomataNewEpsilon(ctxt->am,pxVar4,pxVar3);
    }
    break;
  default:
    xmlErrValid(ctxt,XML_ERR_INTERNAL_ERROR,"ContentModel broken for element %s\n",(char *)name);
    return 0;
  }
  return 1;
}

Assistant:

static int
xmlValidBuildAContentModel(xmlElementContentPtr content,
		           xmlValidCtxtPtr ctxt,
		           const xmlChar *name) {
    if (content == NULL) {
	xmlErrValidNode(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
			"Found NULL content in content model of %s\n",
			name, NULL, NULL);
	return(0);
    }
    switch (content->type) {
	case XML_ELEMENT_CONTENT_PCDATA:
	    xmlErrValidNode(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
			    "Found PCDATA in content model of %s\n",
		            name, NULL, NULL);
	    return(0);
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT: {
	    xmlAutomataStatePtr oldstate = ctxt->state;
	    xmlChar fn[50];
	    xmlChar *fullname;

	    fullname = xmlBuildQName(content->name, content->prefix, fn, 50);
	    if (fullname == NULL) {
	        xmlVErrMemory(ctxt);
		return(0);
	    }

	    switch (content->ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    xmlAutomataNewTransition(ctxt->am, ctxt->state,
			                     ctxt->state, fullname, NULL);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    ctxt->state = xmlAutomataNewEpsilon(ctxt->am,
					    ctxt->state, NULL);
		    xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, ctxt->state, fullname, NULL);
		    break;
	    }
	    if ((fullname != fn) && (fullname != content->name))
		xmlFree(fullname);
	    break;
	}
	case XML_ELEMENT_CONTENT_SEQ: {
	    xmlAutomataStatePtr oldstate, oldend;
	    xmlElementContentOccur ocur;

	    /*
	     * Simply iterate over the content
	     */
	    oldstate = ctxt->state;
	    ocur = content->ocur;
	    if (ocur != XML_ELEMENT_CONTENT_ONCE) {
		ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
		oldstate = ctxt->state;
	    }
	    do {
		if (xmlValidBuildAContentModel(content->c1, ctxt, name) == 0)
                    return(0);
		content = content->c2;
	    } while ((content->type == XML_ELEMENT_CONTENT_SEQ) &&
		     (content->ocur == XML_ELEMENT_CONTENT_ONCE));
	    if (xmlValidBuildAContentModel(content, ctxt, name) == 0)
                return(0);
	    oldend = ctxt->state;
	    ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldend, NULL);
	    switch (ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
	    }
	    break;
	}
	case XML_ELEMENT_CONTENT_OR: {
	    xmlAutomataStatePtr oldstate, oldend;
	    xmlElementContentOccur ocur;

	    ocur = content->ocur;
	    if ((ocur == XML_ELEMENT_CONTENT_PLUS) ||
		(ocur == XML_ELEMENT_CONTENT_MULT)) {
		ctxt->state = xmlAutomataNewEpsilon(ctxt->am,
			ctxt->state, NULL);
	    }
	    oldstate = ctxt->state;
	    oldend = xmlAutomataNewState(ctxt->am);

	    /*
	     * iterate over the subtypes and remerge the end with an
	     * epsilon transition
	     */
	    do {
		ctxt->state = oldstate;
		if (xmlValidBuildAContentModel(content->c1, ctxt, name) == 0)
                    return(0);
		xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldend);
		content = content->c2;
	    } while ((content->type == XML_ELEMENT_CONTENT_OR) &&
		     (content->ocur == XML_ELEMENT_CONTENT_ONCE));
	    ctxt->state = oldstate;
	    if (xmlValidBuildAContentModel(content, ctxt, name) == 0)
                return(0);
	    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldend);
	    ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldend, NULL);
	    switch (ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
	    }
	    break;
	}
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
	                "ContentModel broken for element %s\n",
			(const char *) name);
	    return(0);
    }
    return(1);
}